

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O0

void __thiscall BamTools::MergeTool::~MergeTool(MergeTool *this)

{
  _func_int **pp_Var1;
  AbstractTool *in_RDI;
  MergeSettings *in_stack_ffffffffffffffe0;
  MergeToolPrivate *this_00;
  
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__MergeTool_0033f060;
  pp_Var1 = in_RDI[1]._vptr_AbstractTool;
  if (pp_Var1 != (_func_int **)0x0) {
    MergeSettings::~MergeSettings(in_stack_ffffffffffffffe0);
    operator_delete(pp_Var1);
  }
  in_RDI[1]._vptr_AbstractTool = (_func_int **)0x0;
  this_00 = (MergeToolPrivate *)in_RDI[2]._vptr_AbstractTool;
  if (this_00 != (MergeToolPrivate *)0x0) {
    MergeToolPrivate::~MergeToolPrivate(this_00);
    operator_delete(this_00);
  }
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  AbstractTool::~AbstractTool(in_RDI);
  return;
}

Assistant:

MergeTool::~MergeTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}